

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int it_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,uchar *buffer)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  byte *pbVar6;
  long in_RDX;
  DUMBFILE *in_RSI;
  int *in_RDI;
  uchar b_1;
  uchar b;
  uchar mask;
  uchar channel;
  IT_ENTRY *entry;
  int bufpos;
  int buflen;
  int n_entries;
  uchar ceffectvalue [64];
  uchar ceffect [64];
  uchar cvolpan [64];
  uchar cinstrument [64];
  uchar cnote [64];
  uchar cmask [64];
  undefined4 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  byte bVar7;
  undefined1 in_stack_fffffffffffffe3f;
  long in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int iVar8;
  int n;
  char *in_stack_fffffffffffffe58;
  byte local_168 [64];
  byte local_128 [64];
  byte local_e8 [64];
  byte local_a8 [64];
  byte local_68 [72];
  long local_20;
  DUMBFILE *local_18;
  int *local_10;
  int local_4;
  
  n = 0;
  iVar8 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_68,0,0x40);
  memset(local_a8,0,0x40);
  memset(local_e8,0,0x40);
  memset(local_128,0,0x40);
  memset(local_168,0,0x40);
  memset(&stack0xfffffffffffffe58,0,0x40);
  iVar3 = dumbfile_igetw((DUMBFILE *)
                         CONCAT17(in_stack_fffffffffffffe3f,
                                  CONCAT16(in_stack_fffffffffffffe3e,
                                           CONCAT15(in_stack_fffffffffffffe3d,
                                                    CONCAT14(in_stack_fffffffffffffe3c,
                                                             in_stack_fffffffffffffe38)))));
  iVar4 = dumbfile_igetw((DUMBFILE *)
                         CONCAT17(in_stack_fffffffffffffe3f,
                                  CONCAT16(in_stack_fffffffffffffe3e,
                                           CONCAT15(in_stack_fffffffffffffe3d,
                                                    CONCAT14(in_stack_fffffffffffffe3c,
                                                             in_stack_fffffffffffffe38)))));
  *local_10 = iVar4;
  dumbfile_skip((DUMBFILE *)CONCAT44(iVar8,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40);
  iVar4 = dumbfile_error(local_18);
  if (iVar4 == 0) {
    dumbfile_getnc(in_stack_fffffffffffffe58,n,(DUMBFILE *)CONCAT44(iVar8,in_stack_fffffffffffffe48)
                  );
    iVar4 = dumbfile_error(local_18);
    if (iVar4 == 0) {
      while (iVar8 < iVar3) {
        iVar4 = iVar8 + 1;
        bVar7 = *(byte *)(local_20 + iVar8);
        if (bVar7 == 0) {
          n = n + 1;
          iVar8 = iVar4;
        }
        else {
          bVar2 = bVar7 - 1 & 0x3f;
          if ((bVar7 & 0x80) == 0) {
            bVar7 = local_68[bVar2];
          }
          else {
            bVar7 = *(byte *)(local_20 + iVar4);
            local_68[bVar2] = bVar7;
            iVar4 = iVar8 + 2;
          }
          n = (uint)(bVar7 != 0) + n;
          iVar8 = (uint)""[(int)(bVar7 & 0xf)] + iVar4;
        }
      }
      local_10[1] = n;
      pvVar5 = malloc((long)n * 7);
      *(void **)(local_10 + 2) = pvVar5;
      if (*(long *)(local_10 + 2) == 0) {
        local_4 = -1;
      }
      else {
        iVar8 = 0;
        memset(local_68,0,0x40);
        pbVar6 = *(byte **)(local_10 + 2);
        while (iVar8 < iVar3) {
          iVar4 = iVar8 + 1;
          bVar7 = *(byte *)(local_20 + iVar8);
          if (bVar7 == 0) {
            *pbVar6 = 0xff;
            pbVar6 = pbVar6 + 7;
            iVar8 = iVar4;
          }
          else {
            bVar2 = bVar7 - 1 & 0x3f;
            if ((bVar7 & 0x80) == 0) {
              bVar7 = local_68[bVar2];
              iVar8 = iVar4;
            }
            else {
              bVar7 = *(byte *)(local_20 + iVar4);
              local_68[bVar2] = bVar7;
              iVar8 = iVar8 + 2;
            }
            if (bVar7 != 0) {
              pbVar6[1] = bVar7 & 0xf | (byte)((int)(uint)bVar7 >> 4);
              *pbVar6 = bVar2;
              if ((bVar7 & 1) == 0) {
                if ((bVar7 & 0x10) != 0) {
                  pbVar6[2] = local_a8[bVar2];
                }
              }
              else {
                bVar1 = *(byte *)(local_20 + iVar8);
                pbVar6[2] = bVar1;
                local_a8[bVar2] = bVar1;
                iVar8 = iVar8 + 1;
              }
              if ((bVar7 & 2) == 0) {
                if ((bVar7 & 0x20) != 0) {
                  pbVar6[3] = local_e8[bVar2];
                }
              }
              else {
                bVar1 = *(byte *)(local_20 + iVar8);
                pbVar6[3] = bVar1;
                local_e8[bVar2] = bVar1;
                iVar8 = iVar8 + 1;
              }
              if ((bVar7 & 4) == 0) {
                if ((bVar7 & 0x40) != 0) {
                  pbVar6[4] = local_128[bVar2];
                }
              }
              else {
                bVar1 = *(byte *)(local_20 + iVar8);
                pbVar6[4] = bVar1;
                local_128[bVar2] = bVar1;
                iVar8 = iVar8 + 1;
              }
              if ((bVar7 & 8) == 0) {
                pbVar6[5] = local_168[bVar2];
                pbVar6[6] = (&stack0xfffffffffffffe58)[bVar2];
              }
              else {
                iVar4 = iVar8 + 1;
                bVar7 = *(byte *)(local_20 + iVar8);
                pbVar6[5] = bVar7;
                local_168[bVar2] = bVar7;
                iVar8 = iVar8 + 2;
                bVar7 = *(byte *)(local_20 + iVar4);
                pbVar6[6] = bVar7;
                (&stack0xfffffffffffffe58)[bVar2] = bVar7;
              }
              pbVar6 = pbVar6 + 7;
            }
          }
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int it_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, unsigned char *buffer)
{
	unsigned char cmask[DUMB_IT_N_CHANNELS];
	unsigned char cnote[DUMB_IT_N_CHANNELS];
	unsigned char cinstrument[DUMB_IT_N_CHANNELS];
	unsigned char cvolpan[DUMB_IT_N_CHANNELS];
	unsigned char ceffect[DUMB_IT_N_CHANNELS];
	unsigned char ceffectvalue[DUMB_IT_N_CHANNELS];
#ifdef DETECT_DUPLICATE_CHANNELS
	IT_ENTRY *dupentry[DUMB_IT_N_CHANNELS];
#endif

	int n_entries = 0;
	int buflen;
	int bufpos = 0;

	IT_ENTRY *entry;

	unsigned char channel;
	unsigned char mask;

	memset(cmask, 0, sizeof(cmask));
	memset(cnote, 0, sizeof(cnote));
	memset(cinstrument, 0, sizeof(cinstrument));
	memset(cvolpan, 0, sizeof(cvolpan));
	memset(ceffect, 0, sizeof(ceffect));
	memset(ceffectvalue, 0, sizeof(ceffectvalue));
#ifdef DETECT_DUPLICATE_CHANNELS
	{
		int i;
		for (i = 0; i < DUMB_IT_N_CHANNELS; i++) dupentry[i] = NULL;
	}
#endif

	buflen = dumbfile_igetw(f);
	pattern->n_rows = dumbfile_igetw(f);

	/* Skip four unused bytes. */
	dumbfile_skip(f, 4);

	if (dumbfile_error(f))
		return -1;

	/* Read in the pattern data. */
    dumbfile_getnc((char *)buffer, buflen, f);

	if (dumbfile_error(f))
		return -1;

	/* Scan the pattern data, and work out how many entries we need room for. */
	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0) {
			/* End of row */
			n_entries++;
			continue;
		}

		channel = (b - 1) & 63;

		if (b & 128)
			cmask[channel] = mask = buffer[bufpos++];
		else
			mask = cmask[channel];

		{
			static const unsigned char used[16] = {0, 1, 1, 2, 1, 2, 2, 3, 2, 3, 3, 4, 3, 4, 4, 5};
			n_entries += (mask != 0);
			bufpos += used[mask & 15];
		}
	}

	pattern->n_entries = n_entries;

	pattern->entry = malloc(n_entries * sizeof(*pattern->entry));

	if (!pattern->entry)
		return -1;

	bufpos = 0;
	memset(cmask, 0, sizeof(cmask));

	entry = pattern->entry;

	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0) {
			/* End of row */
			IT_SET_END_ROW(entry);
			entry++;
#ifdef DETECT_DUPLICATE_CHANNELS
			{
				int i;
				for (i = 0; i < DUMB_IT_N_CHANNELS; i++) dupentry[i] = NULL;
			}
#endif
			continue;
		}

		channel = (b - 1) & 63;

		if (b & 128)
			cmask[channel] = mask = buffer[bufpos++];
		else
			mask = cmask[channel];

		if (mask) {
			entry->mask = (mask & 15) | (mask >> 4);
			entry->channel = channel;

			if (mask & IT_ENTRY_NOTE)
				cnote[channel] = entry->note = buffer[bufpos++];
			else if (mask & (IT_ENTRY_NOTE << 4))
				entry->note = cnote[channel];

			if (mask & IT_ENTRY_INSTRUMENT)
				cinstrument[channel] = entry->instrument = buffer[bufpos++];
			else if (mask & (IT_ENTRY_INSTRUMENT << 4))
				entry->instrument = cinstrument[channel];

			if (mask & IT_ENTRY_VOLPAN)
				cvolpan[channel] = entry->volpan = buffer[bufpos++];
			else if (mask & (IT_ENTRY_VOLPAN << 4))
				entry->volpan = cvolpan[channel];

			if (mask & IT_ENTRY_EFFECT) {
				ceffect[channel] = entry->effect = buffer[bufpos++];
				ceffectvalue[channel] = entry->effectvalue = buffer[bufpos++];
			} else {
				entry->effect = ceffect[channel];
				entry->effectvalue = ceffectvalue[channel];
			}

#ifdef DETECT_DUPLICATE_CHANNELS
			if (dupentry[channel]) {
				FILE *f = fopen("dupentry.txt", "a");
				if (!f) abort();
				fprintf(f, "Two events on channel %d:", channel);
				fprintf(f, "  Event #1:");
				if (dupentry[channel]->mask & IT_ENTRY_NOTE      ) fprintf(f, " %03d", dupentry[channel]->note      ); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_INSTRUMENT) fprintf(f, " %03d", dupentry[channel]->instrument); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_VOLPAN    ) fprintf(f, " %03d", dupentry[channel]->volpan    ); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_EFFECT) fprintf(f, " %c%02X\n", 'A' - 1 + dupentry[channel]->effect, dupentry[channel]->effectvalue); else fprintf(f, " ...\n");
				fprintf(f, "  Event #2:");
				if (entry->mask & IT_ENTRY_NOTE      ) fprintf(f, " %03d", entry->note      ); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_INSTRUMENT) fprintf(f, " %03d", entry->instrument); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_VOLPAN    ) fprintf(f, " %03d", entry->volpan    ); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_EFFECT) fprintf(f, " %c%02X\n", 'A' - 1 + entry->effect, entry->effectvalue); else fprintf(f, " ...\n");
				fclose(f);
			}
			dupentry[channel] = entry;
#endif

			entry++;
		}
	}

	ASSERT(entry == pattern->entry + n_entries);

	return 0;
}